

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

uint my_rational_to_uint(my_rational *a,uint scale,uint *remainder)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  wchar_t wVar4;
  uint uVar5;
  size_t sVar6;
  uint a_00;
  uint16_t local_62 [3];
  _Bool over;
  uint16_t w_u16n [3];
  uint16_t rr_u16n [4];
  uint16_t qr_u16n [2];
  uint16_t p_u16n [4];
  uint16_t d_u16n [2];
  uint16_t r2_u16n [2];
  uint16_t r_u16n [2];
  uint t;
  uint r2;
  uint q;
  uint r;
  uint result;
  uint *remainder_local;
  uint scale_local;
  my_rational *a_local;
  
  if (scale == 0) {
    if (remainder != (uint *)0x0) {
      *remainder = 0;
    }
    a_local._4_4_ = 0;
  }
  else {
    uVar2 = a->n / a->d;
    if ((uint)(0xffffffff / (ulong)scale) < uVar2) {
      if (remainder != (uint *)0x0) {
        *remainder = 0;
      }
      a_local._4_4_ = 0xffffffff;
    }
    else {
      uVar2 = scale * uVar2;
      a_00 = a->n % a->d;
      uVar3 = scale / a->d;
      if (-(uVar3 * a_00) - 1 < uVar2) {
        if (remainder != (uint *)0x0) {
          *remainder = 0;
        }
        a_local._4_4_ = 0xffffffff;
      }
      else {
        uVar2 = uVar3 * a_00 + uVar2;
        uVar3 = scale - uVar3 * a->d;
        if ((a_00 == 0) || (uVar3 <= (uint)(0xffffffff / (ulong)a_00))) {
          uVar5 = (a_00 * uVar3) / a->d;
          if (-uVar5 - 1 < uVar2) {
            if (remainder != (uint *)0x0) {
              *remainder = 0;
            }
            a_local._4_4_ = 0xffffffff;
          }
          else {
            a_local._4_4_ = uVar5 + uVar2;
            if (remainder != (uint *)0x0) {
              *remainder = a_00 * uVar3 - uVar5 * a->d;
            }
          }
        }
        else {
          _Var1 = ini_u16n(d_u16n,2,a_00);
          if (_Var1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e5,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var1 = ini_u16n(p_u16n + 2,2,uVar3);
          if (_Var1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e9,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var1 = ini_u16n(p_u16n,2,a->d);
          if (_Var1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6ed,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var1 = mul_u16n(rr_u16n + 2,d_u16n,p_u16n + 2,4,2,2);
          if (_Var1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f2,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          wVar4 = div_u16n(rr_u16n,(uint16_t *)&stack0xffffffffffffffa4,local_62,rr_u16n + 2,p_u16n,
                           2,4,2);
          if (wVar4 != L'\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f7,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          sVar6 = msb_u16n(rr_u16n,2);
          if (0x20 < sVar6) {
            __assert_fail("msb_u16n(qr_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6fa,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          uVar3 = ext_u16n(rr_u16n,2);
          if (-uVar3 - 1 < uVar2) {
            q = 0xffffffff;
            if (remainder != (uint *)0x0) {
              *remainder = 0;
            }
          }
          else {
            q = uVar3 + uVar2;
            if (remainder != (uint *)0x0) {
              sVar6 = msb_u16n((uint16_t *)&stack0xffffffffffffffa4,4);
              if (0x20 < sVar6) {
                __assert_fail("msb_u16n(rr_u16n, 2 * MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                              ,0x700,
                              "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                             );
              }
              uVar2 = ext_u16n((uint16_t *)&stack0xffffffffffffffa4,4);
              *remainder = uVar2;
              if (a->d <= *remainder) {
                __assert_fail("*remainder < a->d",
                              "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                              ,0x702,
                              "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                             );
              }
            }
          }
          a_local._4_4_ = q;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

unsigned int my_rational_to_uint(const struct my_rational *a,
		unsigned int scale, unsigned int *remainder)
{
	unsigned int result, r, q, r2, t;

	if (!scale) {
		if (remainder) {
			*remainder = 0;
		}
		return 0;
	}
	result = a->n / a->d;
	if (result > UINT_MAX / scale) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result *= scale;
	r = a->n % a->d;
	q = scale / a->d;
	if (result > UINT_MAX - q * r) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q * r;
	r2 = scale - q * a->d;
	if (r && r2 > UINT_MAX / r) {
		/*
		 * The product of the remainders overflows in the native
		 * arithmetic so use multiprecision integers.
		 */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t r_u16n[MP_DIGITS], r2_u16n[MP_DIGITS];
		uint16_t d_u16n[MP_DIGITS], p_u16n[2 * MP_DIGITS];
		uint16_t qr_u16n[MP_DIGITS], rr_u16n[2 * MP_DIGITS];
		uint16_t w_u16n[MP_DIGITS + 1];
		bool over;

		over = ini_u16n(r_u16n, MP_DIGITS, r);
		if (over) {
			assert(0);
		}
		over = ini_u16n(r2_u16n, MP_DIGITS, r2);
		if (over) {
			assert(0);
		}
		over = ini_u16n(d_u16n, MP_DIGITS, a->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(p_u16n, r_u16n, r2_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(qr_u16n, rr_u16n, w_u16n, p_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, MP_DIGITS) != 0);
		if (over) {
			assert(0);
		}
		assert(msb_u16n(qr_u16n, MP_DIGITS)
			<= sizeof(unsigned int) * CHAR_BIT);
		q = ext_u16n(qr_u16n, MP_DIGITS);
		if (result <= UINT_MAX - q) {
			result += q;
			if (remainder) {
				assert(msb_u16n(rr_u16n, 2 * MP_DIGITS)
					<= sizeof(unsigned int) * CHAR_BIT);
				*remainder = ext_u16n(rr_u16n, 2 * MP_DIGITS);
				assert(*remainder < a->d);
			}
		} else {
			result = UINT_MAX;
			if (remainder) {
				*remainder = 0;
			}
		}
		return result;
#undef MP_DIGITS
	}
	t = r * r2;
	q = t / a->d;
	if (result > UINT_MAX - q) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q;
	if (remainder) {
		*remainder = t - q * a->d;
	}
	return result;
}